

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void google::protobuf::UninterpretedOption::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  _func_int **pp_Var2;
  ulong uVar3;
  Nonnull<const_char_*> pcVar4;
  Arena *pAVar5;
  
  if (from_msg == to_msg) {
    pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (from_msg,to_msg,"&from != _this");
  }
  else {
    pcVar4 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar4 != (Nonnull<const_char_*>)0x0) {
    MergeImpl();
  }
  if (*(int *)&from_msg[2]._vptr_MessageLite != 0) {
    internal::RepeatedPtrFieldBase::MergeFromConcreteMessage
              ((RepeatedPtrFieldBase *)&to_msg[1]._internal_metadata_,
               (RepeatedPtrFieldBase *)&from_msg[1]._internal_metadata_,
               Arena::CopyConstruct<google::protobuf::UninterpretedOption_NamePart>);
  }
  uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
  if ((uVar1 & 0x3f) != 0) {
    if ((uVar1 & 1) != 0) {
      pp_Var2 = from_msg[3]._vptr_MessageLite;
      *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 1;
      pAVar5 = (Arena *)(to_msg->_internal_metadata_).ptr_;
      if (((ulong)pAVar5 & 1) != 0) {
        pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
      }
      internal::ArenaStringPtr::Set<>
                ((ArenaStringPtr *)(to_msg + 3),(string *)((ulong)pp_Var2 & 0xfffffffffffffffc),
                 pAVar5);
    }
    if ((uVar1 & 2) != 0) {
      uVar3 = from_msg[3]._internal_metadata_.ptr_;
      *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 2;
      pAVar5 = (Arena *)(to_msg->_internal_metadata_).ptr_;
      if (((ulong)pAVar5 & 1) != 0) {
        pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
      }
      internal::ArenaStringPtr::Set<>
                ((ArenaStringPtr *)&to_msg[3]._internal_metadata_,
                 (string *)(uVar3 & 0xfffffffffffffffc),pAVar5);
    }
    if ((uVar1 & 4) != 0) {
      pp_Var2 = from_msg[4]._vptr_MessageLite;
      *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 4;
      pAVar5 = (Arena *)(to_msg->_internal_metadata_).ptr_;
      if (((ulong)pAVar5 & 1) != 0) {
        pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
      }
      internal::ArenaStringPtr::Set<>
                ((ArenaStringPtr *)(to_msg + 4),(string *)((ulong)pp_Var2 & 0xfffffffffffffffc),
                 pAVar5);
    }
    if ((uVar1 & 8) != 0) {
      to_msg[4]._internal_metadata_.ptr_ = from_msg[4]._internal_metadata_.ptr_;
    }
    if ((uVar1 & 0x10) != 0) {
      to_msg[5]._vptr_MessageLite = from_msg[5]._vptr_MessageLite;
    }
    if ((uVar1 & 0x20) != 0) {
      to_msg[5]._internal_metadata_.ptr_ = from_msg[5]._internal_metadata_.ptr_;
    }
  }
  *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | uVar1;
  uVar3 = (from_msg->_internal_metadata_).ptr_;
  if ((uVar3 & 1) == 0) {
    return;
  }
  internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
            (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar3 & 0xfffffffffffffffe) + 8));
  return;
}

Assistant:

void UninterpretedOption::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<UninterpretedOption*>(&to_msg);
  auto& from = static_cast<const UninterpretedOption&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.UninterpretedOption)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_name()->MergeFrom(
      from._internal_name());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000003fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_identifier_value(from._internal_identifier_value());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_internal_set_string_value(from._internal_string_value());
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_internal_set_aggregate_value(from._internal_aggregate_value());
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_impl_.positive_int_value_ = from._impl_.positive_int_value_;
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      _this->_impl_.negative_int_value_ = from._impl_.negative_int_value_;
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      _this->_impl_.double_value_ = from._impl_.double_value_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}